

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall QDateTimeEditPrivate::_q_resetButton(QDateTimeEditPrivate *this)

{
  QWidget *this_00;
  
  if (this->arrowState != State_None) {
    this_00 = *(QWidget **)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
    this->arrowState = State_None;
    (this->super_QAbstractSpinBoxPrivate).buttonState = 0;
    (this->super_QAbstractSpinBoxPrivate).hoverControl = SC_ComboBoxFrame;
    QWidget::update(this_00);
    return;
  }
  return;
}

Assistant:

void QDateTimeEditPrivate::updateArrow(QStyle::StateFlag state)
{
    Q_Q(QDateTimeEdit);

    if (arrowState == state)
        return;
    arrowState = state;
    if (arrowState != QStyle::State_None)
        buttonState |= Mouse;
    else {
        buttonState = 0;
        hoverControl = QStyle::SC_ComboBoxFrame;
    }
    q->update();
}